

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamical-system-simulator.cpp
# Opt level: O0

Vector __thiscall
stateObservation::DynamicalSystemSimulator::getMeasurement
          (DynamicalSystemSimulator *this,TimeIndex k)

{
  bool bVar1;
  TimeSize TVar2;
  TimeIndex TVar3;
  Matrix<double,__1,_1,_0,__1,_1> *other;
  long in_RDX;
  Index extraout_RDX;
  Vector VVar4;
  TimeIndex k_local;
  DynamicalSystemSimulator *this_local;
  
  TVar2 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::size((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)(k + 0x68));
  if (TVar2 != 0) {
    TVar3 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::getFirstIndex((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             *)(k + 0x68));
    bVar1 = false;
    if (in_RDX <= TVar3) goto LAB_001b81c8;
  }
  bVar1 = true;
LAB_001b81c8:
  if (!bVar1) {
    __assert_fail("(y_.size() == 0 || y_.getFirstIndex() < k) && \"ERROR: Only future measurements can be obtained\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/dynamical-system-simulator.cpp"
                  ,0x24,
                  "virtual Vector stateObservation::DynamicalSystemSimulator::getMeasurement(TimeIndex)"
                 );
  }
  TVar3 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::getNextIndex((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          *)(k + 0x68));
  if (TVar3 < in_RDX) {
    (**(code **)(*(long *)k + 0x40))(k,in_RDX);
  }
  other = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)(k + 0x68),in_RDX);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)this,other);
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector DynamicalSystemSimulator::getMeasurement(TimeIndex k)
{
  BOOST_ASSERT((y_.size() == 0 || y_.getFirstIndex() < k) && "ERROR: Only future measurements can be obtained");
  if(y_.getNextIndex() < k) simulateDynamicsTo(k);

  return y_[k];
}